

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

value * __thiscall
mjs::anon_unknown_35::unescape
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  runtime_error *this_00;
  size_t sVar1;
  gc_heap_ptr<mjs::global_object> *pgVar2;
  wchar_t wVar3;
  gc_heap_ptr_untyped local_70;
  wstring res;
  wstring_view local_40;
  
  sVar1 = s._M_len;
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = L'\0';
  pgVar2 = (gc_heap_ptr<mjs::global_object> *)0x0;
  do {
    if (global <= pgVar2) {
      local_40._M_len = res._M_string_length;
      local_40._M_str = res._M_dataplus._M_p;
      string::string((string *)&local_70,*(gc_heap **)this,&local_40);
      value::value(__return_storage_ptr__,(string *)&local_70);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
      std::__cxx11::wstring::~wstring((wstring *)&res);
      return __return_storage_ptr__;
    }
    wVar3 = (wchar_t)&res;
    if (*(int *)(sVar1 + (long)pgVar2 * 4) == 0x25) {
      if (global < (gc_heap_ptr<mjs::global_object> *)
                   ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 3U)) {
LAB_00135ced:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Invalid string in unescape");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*(int *)(sVar1 + 4 + (long)pgVar2 * 4) == 0x75) {
        if (global < (gc_heap_ptr<mjs::global_object> *)
                     ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 6U)) goto LAB_00135ced;
        get_hex_value4((wchar_t *)(sVar1 + 8 + (long)pgVar2 * 4));
        std::__cxx11::wstring::push_back(wVar3);
        pgVar2 = (gc_heap_ptr<mjs::global_object> *)
                 ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 5);
      }
      else {
        get_hex_value2((wchar_t *)((long)pgVar2 * 4 + sVar1 + 4));
        std::__cxx11::wstring::push_back(wVar3);
        pgVar2 = (gc_heap_ptr<mjs::global_object> *)
                 ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 2);
      }
    }
    else {
      std::__cxx11::wstring::push_back(wVar3);
    }
    pgVar2 = (gc_heap_ptr<mjs::global_object> *)
             ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 1);
  } while( true );
}

Assistant:

value unescape(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (size_t i = 0; i < s.length(); ++i) {
        if (s[i] != '%') {
            res.push_back(s[i]);
            continue;
        }
        ++i;
        if (i + 2 > s.length() || (s[i] == 'u' && i + 5 > s.length())) {
            throw std::runtime_error("Invalid string in unescape");
        }
        if (s[i] == 'u') {
            res.push_back(static_cast<wchar_t>(get_hex_value4(&s[i+1])));
            i += 4;
        } else {
            res.push_back(static_cast<wchar_t>(get_hex_value2(&s[i])));
            i += 1;
        }
    }
    return value{string{global.heap(), res}};
}